

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# affine_fixed16.c
# Opt level: O0

rt_function_error_t exec_affine_fixed16(rt_function_t *f)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint uVar4;
  int iVar5;
  long *plVar6;
  long lVar7;
  long lVar8;
  void *__s;
  long lVar9;
  byte bVar10;
  byte bVar11;
  int16_t iVar12;
  int iVar13;
  int bpos;
  int opos;
  int16_t *bias_1;
  int64_t sum;
  int16_t *w_addr;
  int16_t *i_addr;
  short *psStack_88;
  int weight_offset;
  int16_t *alpha_addr;
  int16_t *o_addr;
  int input_offset;
  int output_offset;
  int i_1;
  int16_t *bias;
  uint bias_size;
  uint out_fp;
  uint b_fp;
  uint nbits_rescale;
  int16_t *alpha;
  int16_t *output;
  int16_t *weight;
  int16_t *input;
  int local_28;
  int k;
  int j;
  int i;
  affine_private_t *p;
  rt_function_t *f_local;
  
  plVar6 = *f->local_context;
  lVar7 = *(long *)(*plVar6 + 0x18);
  lVar8 = *(long *)(plVar6[2] + 0x18);
  __s = *(void **)(plVar6[8] + 0x18);
  _b_fp = (short *)0x0;
  bVar1 = *(byte *)(*plVar6 + 0x10);
  bVar2 = *(byte *)(plVar6[2] + 0x10);
  bVar3 = *(byte *)(plVar6[8] + 0x10);
  if (plVar6[6] != 0) {
    _b_fp = *(short **)(plVar6[6] + 0x18);
  }
  if (plVar6[4] != 0) {
    bVar10 = *(byte *)(plVar6[4] + 0x10) >> 4;
    bVar11 = *(byte *)(plVar6[8] + 0x10) >> 4;
    uVar4 = *(uint *)(plVar6 + 0xd);
    lVar9 = *(long *)(plVar6[4] + 0x18);
    if (bVar11 < bVar10) {
      for (input_offset = 0; (uint)input_offset < uVar4; input_offset = input_offset + 1) {
        *(short *)(lVar9 + (long)input_offset * 2) =
             (short)((int)*(short *)(lVar9 + (long)input_offset * 2) /
                    (1 << (bVar10 - bVar11 & 0x1f)));
      }
    }
    else if (bVar10 < bVar11) {
      printf(
            "OUTPUT variable has less range bits than BIAS variable. Please make sure affine/b has same or less range bits than Output to avoid overflow.\n"
            );
      return RT_FUNCTION_ERROR_UNIMPLEMENTED;
    }
  }
  memset(__s,0,(long)(int)plVar6[9] << 1);
  for (input._4_4_ = 0; input._4_4_ < (int)plVar6[0xc]; input._4_4_ = input._4_4_ + 1) {
    iVar13 = input._4_4_ * (int)plVar6[0xd];
    iVar5 = *(int *)((long)plVar6 + 100);
    alpha_addr = (int16_t *)((long)__s + (long)iVar13 * 2);
    psStack_88 = _b_fp;
    for (local_28 = 0; local_28 < (int)plVar6[0xd]; local_28 = local_28 + 1) {
      bias_1 = (int16_t *)0x0;
      sum = lVar8 + (long)(local_28 * *(int *)((long)plVar6 + 100)) * 2;
      w_addr = (int16_t *)(lVar7 + (long)(input._4_4_ * iVar5) * 2);
      for (k = 0; k < *(int *)((long)plVar6 + 100); k = k + 1) {
        bias_1 = (int16_t *)((long)((int)*w_addr * (int)*(short *)sum) + (long)bias_1);
        sum = sum + 2;
        w_addr = w_addr + 1;
      }
      iVar12 = saturate64_to_16((long)bias_1 /
                                (long)(1 << (((bVar1 >> 4) + (bVar2 >> 4)) - (bVar3 >> 4) & 0x1f)));
      *alpha_addr = iVar12;
      if (_b_fp != (short *)0x0) {
        *alpha_addr = (int16_t)(((int)*alpha_addr * (int)*psStack_88) /
                               (1 << (*(byte *)(plVar6[6] + 0x10) >> 4)));
        psStack_88 = psStack_88 + 1;
      }
      alpha_addr = alpha_addr + 1;
    }
    if (plVar6[4] != 0) {
      lVar9 = *(long *)(plVar6[4] + 0x18);
      for (k = 0; k < (int)plVar6[0xd]; k = k + 1) {
        sum_acc_sat16((int16_t *)((long)__s + (long)(iVar13 + k) * 2),
                      *(int16_t *)(lVar9 + (long)k * 2));
      }
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}

Assistant:

rt_function_error_t exec_affine_fixed16(rt_function_t *f) {
  affine_private_t *p =
      (affine_private_t *)(((affine_local_context_t *)(f->local_context))
                               ->data);
  int i, j, k; // Iterators.

  int16_t *input = (int16_t *)(p->input->data);
  int16_t *weight = (int16_t *)(p->weight->data);
  int16_t *output = (int16_t *)(p->output->data);
  int16_t *alpha = 0;

  const unsigned nbits_rescale =
      p->input->fp_pos + p->weight->fp_pos - p->output->fp_pos;

  if (p->alpha) {
    alpha = (int16_t *)p->alpha->data;
  }

  // If bias has less range bits (=more precision bits) than output, rescale
  // bias.
  // Otherwise, output has too few range bits. Change format before starting
  // computations.
  if (p->bias) {
    const unsigned int b_fp = p->bias->fp_pos;
    const unsigned int out_fp = p->output->fp_pos;
    const unsigned bias_size = p->output_loop_size;
    int16_t *bias = (int16_t *)(p->bias->data);

    if (b_fp > out_fp) {
      int i;
      for (i = 0; i < bias_size; i++) {
        *(bias + i) /= (1 << (b_fp - out_fp));
      }
    } else if (b_fp < out_fp) {
      printf(
          "OUTPUT variable has less range bits than BIAS variable. Please "
          "make sure affine/b has same or less range bits than Output to avoid "
          "overflow.\n");
      return RT_FUNCTION_ERROR_UNIMPLEMENTED;
    }
  }

  // Clear output
  memset(output, 0, sizeof(int16_t) * p->output_size);

  for (k = 0; k < p->base_loop_size; k++) {
    int output_offset = k * p->output_loop_size;
    int input_offset = k * p->input_loop_size;
    int16_t *o_addr = output + output_offset;
    int16_t *alpha_addr = alpha;

    for (j = 0; j < p->output_loop_size; ++j) {
      int weight_offset = j * p->input_loop_size;

      int16_t *i_addr = input + input_offset;
      int16_t *w_addr = weight + weight_offset;
      int64_t sum = 0;

      for (i = 0; i < p->input_loop_size; ++i) {
        sum += (*i_addr++) * (*w_addr++);
      }
      // Rescale output to desired # of precision bits
      *o_addr = saturate64_to_16(sum / (1 << nbits_rescale));

      if (alpha) {
        *o_addr = (((int32_t)(*o_addr) * (int32_t)(*alpha_addr++))) /
                  (1 << p->alpha->fp_pos);
      }
      ++o_addr;
    }

    // Bias
    if (p->bias) {
      int16_t *bias = (int16_t *)(p->bias->data);
      for (i = 0; i < p->output_loop_size; i++) {
        int opos = output_offset + i;
        int bpos = i;
        sum_acc_sat16(output + opos, *(bias + bpos));
      }
    }
  }
  return RT_FUNCTION_ERROR_NOERROR;
}